

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlenc.h
# Opt level: O1

size_t vlenc_u64(uint64_t val,uchar *buf)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  uint64_t uVar5;
  
  sVar3 = 1;
  if (0x7f < val) {
    lVar2 = 0;
    uVar5 = val;
    do {
      lVar4 = lVar2;
      buf[lVar4] = (byte)uVar5 | 0x80;
      val = uVar5 >> 7;
      bVar1 = 0x3fff < uVar5;
      lVar2 = lVar4 + 1;
      uVar5 = val;
    } while (bVar1);
    buf = buf + lVar4 + 1;
    sVar3 = lVar4 + 2;
  }
  *buf = (uchar)val;
  return sVar3;
}

Assistant:

inline size_t vlenc_u64(uint64_t val, unsigned char* buf)
{
    size_t nbytes = 0;

    while (val > 0x7F) {
        *buf++ = (val & 0x7F) | 0x80;
        val >>= 7;
        ++nbytes;
    }

    *buf++ = val;
    ++nbytes;

    return nbytes;
}